

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O1

dropt_error set_option_value(dropt_context *context,dropt_option *option,dropt_char *optionArgument)

{
  undefined2 uVar1;
  undefined6 uVar2;
  dropt_error dVar3;
  undefined8 extraout_RAX;
  dropt_char *in_RCX;
  char extraout_DL;
  char_array optionName;
  undefined8 uStack_10;
  
  if (option == (dropt_option *)0x0) {
    uStack_10 = (code *)0x1035f3;
    __assert_fail("option != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0x3d4,
                  "dropt_error set_option_value(dropt_context *, const dropt_option *, const dropt_char *)"
                 );
  }
  if (option->handler != (dropt_option_handler_func)0x0) {
    dVar3 = (*option->handler)(context,option,optionArgument,option->dest);
    return dVar3;
  }
  uStack_10 = set_short_option_error_details;
  set_option_value_cold_1();
  uVar1 = (undefined2)((ulong)extraout_RAX >> 0x30);
  uStack_10._0_6_ = CONCAT24(0x3f2d,(int)extraout_RAX);
  uVar2 = (undefined6)uStack_10;
  uStack_10 = (code *)(CONCAT26(uVar1,(undefined6)uStack_10) & 0xff00ffffffffffff);
  if (extraout_DL != '\0') {
    uStack_10._0_6_ = CONCAT15(extraout_DL,(int5)uVar2);
    uStack_10 = (code *)(CONCAT26(uVar1,(undefined6)uStack_10) & 0xff00ffffffffffff);
    optionName.len = 2;
    optionName.s = (dropt_char *)((long)&uStack_10 + 4);
    set_error_details(context,(dropt_error)option,optionName,in_RCX);
    return (dropt_error)uStack_10;
  }
  __assert_fail("shortName != DROPT_TEXT_LITERAL(\'\\0\')",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
                0x242,
                "void set_short_option_error_details(dropt_context *, dropt_error, dropt_char, const dropt_char *)"
               );
}

Assistant:

static dropt_error
set_option_value(dropt_context* context,
                 const dropt_option* option, const dropt_char* optionArgument)
{
    assert(option != NULL);

    if (option->handler == NULL)
    {
        DROPT_MISUSE("No option handler specified.");
        return dropt_error_bad_configuration;
    }

    return option->handler(context, option, optionArgument,
                           option->dest);
}